

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O1

void __thiscall Example::displayScene(Example *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  sch::CD_Scene::sceneProximityQuery();
  if (*(long *)&this->field_0x10 != *(long *)&this->field_0x8) {
    uVar3 = 0;
    do {
      iVar2 = (int)uVar3;
      if (iVar2 != 0) {
        iVar1 = 0;
        do {
          sch::CD_Pair::getDistanceWithoutPenetrationDepth();
          iVar1 = iVar1 + 1;
        } while (iVar2 != iVar1);
      }
      uVar3 = (ulong)(iVar2 + 1);
    } while (uVar3 < (ulong)(*(long *)&this->field_0x10 - *(long *)&this->field_0x8 >> 3));
  }
  return;
}

Assistant:

void Example::displayScene()
{
  //Calls the computation of the distance (including penertation and witness
  //points) for all the scene, it returns the number of collisions.
  //Other implementations of the scene management could be considered for
  //future versions.
  int collisionNbr = sObj.sceneProximityQuery();

  (void) collisionNbr; ///prevent warning for unused variable

  for (unsigned i=0; i<sObj.size(); ++i)
  {
    for (unsigned j=0; j<i; ++j)
    {
      //Our witness points
      Point3 p1,p2;

      //Get the SQUARED distance and witness points of the last proximity
      //query (see example0.cpp for details on output interpretation)
      //Warning: this does not recompute the distance, even if one object
      //moved after the scene proximity query.
      sObj.getWitnessPoints(i,j,p1,p2);

      //We can get access to the pairs of objects. This will recompute the
      //distance if the objects moved. See example0 for details on how to
      //use the pair object.
      CD_Pair * ptr = sObj(i,j);
      ptr->getDistanceWithoutPenetrationDepth();
    }
  }
}